

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSocketConnectionTests::TestSessionConnection::TestSessionConnection
          (TestSessionConnection *this)

{
  SocketConnection *pSVar1;
  SocketConnection *this_00;
  
  BaseSocketConnection::BaseSocketConnection(&this->super_BaseSocketConnection);
  (this->pSocketConnection)._M_t.
  super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>.
  super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl = (SocketConnection *)0x0;
  this_00 = (SocketConnection *)operator_new(0x2180);
  FIX::SocketConnection::SocketConnection
            (this_00,&((this->super_BaseSocketConnection).testInitiator._M_t.
                       super___uniq_ptr_impl<SuiteSocketConnectionTests::TestSocketInitiator,_std::default_delete<SuiteSocketConnectionTests::TestSocketInitiator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_SuiteSocketConnectionTests::TestSocketInitiator_*,_std::default_delete<SuiteSocketConnectionTests::TestSocketInitiator>_>
                       .
                       super__Head_base<0UL,_SuiteSocketConnectionTests::TestSocketInitiator_*,_false>
                      ._M_head_impl)->super_SocketInitiator,
             &(this->super_BaseSocketConnection).initiatorSessionID,
             (this->super_BaseSocketConnection).socket,
             &(this->super_BaseSocketConnection).monitor.super_SocketMonitor);
  pSVar1 = (this->pSocketConnection)._M_t.
           super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>
           ._M_t.
           super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>
           .super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl;
  (this->pSocketConnection)._M_t.
  super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>.
  super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl = this_00;
  if (pSVar1 != (SocketConnection *)0x0) {
    (**(code **)(*(long *)pSVar1 + 8))();
    return;
  }
  return;
}

Assistant:

TestSessionConnection() : BaseSocketConnection(){
      pSocketConnection.reset(new SocketConnection( *testInitiator, initiatorSessionID, socket, &monitor ));
    }